

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

void angry_priest(void)

{
  char cVar1;
  char cVar2;
  monst *mtmp;
  char local_20;
  char local_1c;
  rm *loc;
  monst *priest;
  
  cVar2 = temple_occupied(u.urooms);
  mtmp = findpriest(cVar2);
  if (mtmp != (monst *)0x0) {
    wakeup(mtmp);
    cVar2 = mtmp->field_0x76;
    cVar1 = mtmp->field_0x77;
    if (level->locations[cVar2][cVar1].typ == '!') {
      if ((*(uint *)&level->locations[cVar2][cVar1].field_0x6 >> 4 & 7) == 0) {
        local_1c = -0x80;
      }
      else {
        if ((*(uint *)&level->locations[cVar2][cVar1].field_0x6 >> 4 & 7) == 4) {
          local_20 = '\x01';
        }
        else {
          local_20 = ((byte)(*(uint *)&level->locations[cVar2][cVar1].field_0x6 >> 4) & 7) - 2;
        }
        local_1c = local_20;
      }
      if (local_1c == mtmp->field_0x74) {
        return;
      }
    }
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xefffffff;
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfbffffff | 0x4000000;
    mtmp->field_0x75 = 0;
  }
  return;
}

Assistant:

void angry_priest(void)
{
	struct monst *priest;
	struct rm *loc;

	if ((priest = findpriest(temple_occupied(u.urooms))) != 0) {
	    wakeup(priest);
	    /*
	     * If the altar has been destroyed or converted, let the
	     * priest run loose.
	     * (When it's just a conversion and there happens to be
	     *	a fresh corpse nearby, the priest ought to have an
	     *	opportunity to try converting it back; maybe someday...)
	     */
	    loc = &level->locations[EPRI(priest)->shrpos.x][EPRI(priest)->shrpos.y];
	    if (!IS_ALTAR(loc->typ) ||
		((aligntyp)Amask2align(loc->altarmask & AM_MASK) !=
			EPRI(priest)->shralign)) {
		priest->ispriest = 0;		/* now a roamer */
		priest->isminion = 1;		/* but still aligned */
		/* this overloads the `shroom' field, which is now clobbered */
		EPRI(priest)->renegade = 0;
	    }
	}
}